

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile-record.c
# Opt level: O2

int big_record_view_field(BigRecordType *rtype,int i,BigArray *array,size_t size,void *buf)

{
  BigRecordField *pBVar1;
  int iVar2;
  ptrdiff_t strides [2];
  size_t dims [2];
  
  pBVar1 = rtype->fields;
  dims[1] = (size_t)pBVar1[i].nmemb;
  strides[0] = rtype->itemsize;
  strides[1] = (ptrdiff_t)pBVar1[i].elsize;
  dims[0] = size;
  iVar2 = big_array_init(array,(void *)((long)pBVar1[i].offset + (long)buf),pBVar1[i].dtype,2,dims,
                         strides);
  return iVar2;
}

Assistant:

int
big_record_view_field(const BigRecordType * rtype,
    int i,
    BigArray * array,
    size_t size,
    void * buf
)
{
    char * p = buf;
    size_t dims[2] = { size, rtype->fields[i].nmemb };
    ptrdiff_t strides[2] = { rtype->itemsize, rtype->fields[i].elsize };
    return big_array_init(array, &p[rtype->fields[i].offset],
                          rtype->fields[i].dtype,
                          2, dims, strides);
}